

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O1

bool __thiscall
pstore::command_line::
opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
::value(opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
        *this,string *v)

{
  bool bVar1;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> m;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_38;
  
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_38,&this->parser_,v);
  bVar1 = local_38.valid_;
  if (local_38.valid_ == true) {
    maybe<std::__cxx11::string,void>::
    value_impl<pstore::maybe<std::__cxx11::string,void>&,std::__cxx11::string>(&local_38);
    std::__cxx11::string::_M_assign((string *)&this->value_);
  }
  if (local_38.valid_ == true) {
    local_38.valid_ = false;
    if (local_38.storage_.__align !=
        (anon_struct_8_0_00000001_for___align)((long)&local_38.storage_ + 0x10)) {
      operator_delete((void *)local_38.storage_.__align,local_38.storage_._16_8_ + 1);
    }
  }
  return bVar1;
}

Assistant:

bool opt<T, Parser>::value (std::string const & v) {
            if (auto m = parser_ (v)) {
                value_ = m.value ();
                return true;
            }
            return false;
        }